

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall gvr::Mesh::resizeVertexList(Mesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0xffffffffffffffff;
  if (-1 < vn) {
    uVar5 = (long)(vn * 3) * 4;
  }
  pfVar2 = (float *)operator_new__(uVar5);
  iVar4 = (this->super_PointCloud).n;
  if (vn <= iVar4) {
    iVar4 = vn;
  }
  pfVar1 = this->normal;
  for (uVar5 = (ulong)(uint)(iVar4 * 3); 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    pfVar2[uVar5 - 1] = pfVar1[uVar5 - 1];
  }
  for (lVar3 = (long)(iVar4 * 3); lVar3 < vn * 3; lVar3 = lVar3 + 1) {
    pfVar2[lVar3] = 0.0;
  }
  if (pfVar1 != (float *)0x0) {
    operator_delete__(pfVar1);
  }
  this->normal = pfVar2;
  PointCloud::resizeVertexList(&this->super_PointCloud,vn,with_scanprop,with_scanpos);
  return;
}

Assistant:

void Mesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=normal[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] normal;

  normal=p;

  PointCloud::resizeVertexList(vn, with_scanprop, with_scanpos);
}